

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int openDirectory(char *zFilename,int *pFd)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  uint *puVar4;
  int iVar5;
  long in_FS_OFFSET;
  char local_238 [528];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_238,0xaa,0x201);
  sqlite3_snprintf(0x200,local_238,"%s",zFilename);
  uVar2 = strlen(local_238);
  if (0 < (int)uVar2) {
    do {
      if (local_238[uVar2 & 0xffffffff] == '/') {
        pcVar3 = local_238 + (uVar2 & 0xffffffff);
        goto LAB_0013333a;
      }
      iVar1 = (int)uVar2;
      uVar2 = (ulong)(iVar1 - 1);
    } while (1 < iVar1);
  }
  if (local_238[0] != '/') {
    local_238[0] = '.';
  }
  pcVar3 = local_238 + 1;
LAB_0013333a:
  *pcVar3 = '\0';
  iVar5 = 0;
  iVar1 = robust_open(local_238,0,0);
  *pFd = iVar1;
  if (iVar1 < 0) {
    iVar5 = 0xe;
    sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xa554,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
    puVar4 = (uint *)__errno_location();
    sqlite3_log(0xe,"os_unix.c:%d: (%d) %s(%s) - %s",0xa554,(ulong)*puVar4,"openDirectory",local_238
                ,"");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar5;
  }
  __stack_chk_fail();
}

Assistant:

static int openDirectory(const char *zFilename, int *pFd){
  int ii;
  int fd = -1;
  char zDirname[MAX_PATHNAME+1];

  sqlite3_snprintf(MAX_PATHNAME, zDirname, "%s", zFilename);
  for(ii=(int)strlen(zDirname); ii>0 && zDirname[ii]!='/'; ii--);
  if( ii>0 ){
    zDirname[ii] = '\0';
  }else{
    if( zDirname[0]!='/' ) zDirname[0] = '.';
    zDirname[1] = 0;
  }
  fd = robust_open(zDirname, O_RDONLY|O_BINARY, 0);
  if( fd>=0 ){
    OSTRACE(("OPENDIR %-3d %s\n", fd, zDirname));
  }
  *pFd = fd;
  if( fd>=0 ) return SQLITE_OK;
  return unixLogError(SQLITE_CANTOPEN_BKPT, "openDirectory", zDirname);
}